

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweeper_kba_c_kernels.h
# Opt level: O0

void Sweeper_get_semiblock_bounds
               (Bool_t *has_lo,Bool_t *has_hi,int *imin,int *imax,int *imax_up2,int ncell,int dim,
               int dir,int semiblock_step,int nsemiblock)

{
  Bool_t BVar1;
  Bool_t BVar2;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined1 local_3e;
  undefined1 local_3d;
  Bool_t is_semiblock_lo;
  Bool_t is_semiblocked;
  int ncell_local;
  int *imax_up2_local;
  int *imax_local;
  int *imin_local;
  Bool_t *has_hi_local;
  Bool_t *has_lo_local;
  
  BVar1 = is_axis_semiblocked(nsemiblock,dim);
  BVar2 = is_semiblock_min_when_semiblocked(nsemiblock,semiblock_step,dim,dir);
  local_3d = 1;
  if (BVar2 == 0) {
    local_3d = BVar1 != 0 ^ 0xff;
  }
  *has_lo = (uint)(local_3d & 1);
  local_3e = 1;
  if (BVar2 != 0) {
    local_3e = BVar1 != 0 ^ 0xff;
  }
  *has_hi = (uint)(local_3e & 1);
  if (*has_lo == 0) {
    local_44 = (ncell + 1) / 2;
  }
  else {
    local_44 = 0;
  }
  *imin = local_44;
  if (*has_hi == 0) {
    local_48 = (ncell + 1) / 2 + -1;
  }
  else {
    local_48 = ncell + -1;
  }
  *imax = local_48;
  if (((BVar1 == 0) || (ncell % 2 == 0)) || (BVar2 != 0)) {
    local_4c = *imax;
  }
  else {
    local_4c = *imax + 1;
  }
  *imax_up2 = local_4c;
  return;
}

Assistant:

TARGET_HD static inline void Sweeper_get_semiblock_bounds(
  Bool_t* __restrict__ has_lo,
  Bool_t* __restrict__ has_hi,
  int*    __restrict__ imin,
  int*    __restrict__ imax,
  int*    __restrict__ imax_up2,
  int ncell,
  int dim,
  int dir,
  int semiblock_step,
  int nsemiblock
  )
{
  /*===================================================================
  =    is_semiblocked: indicate whether the block is broken into
  =      semiblocks along the x axis.
  =    is_semiblock_lo: on this semiblock step for this thread
  =      do we process the lower or the higher semiblock along
  =      the x axis.  Only meaningful if is_semiblocked.
  =    has_lo: does this semiblock contain the lowest cell of the
  =      block along the selected axis.
  =    has_hi: similarly.
  =    imin: the lowest cell boundary of the semiblock within the
  =      block along the selected axis, inclusive of endpoints.
  =    imax: similarly.
  =    imax_up2: make lower/upper semiblock of same size, so that
  =      every device octant thread has the same loop trip count,
  =      so that syncthreads works right, later mask out the
  =      added cells so no real work is done.
  ===================================================================*/

  const Bool_t is_semiblocked = is_axis_semiblocked(nsemiblock, dim);
  const Bool_t is_semiblock_lo = is_semiblock_min_when_semiblocked(
            nsemiblock, semiblock_step, dim, dir );

  *has_lo =     is_semiblock_lo   || ! is_semiblocked;
  *has_hi = ( ! is_semiblock_lo ) || ! is_semiblocked;

  /*---Get semiblock bounds, inclusive of endpoints---*/

  *imin =     *has_lo   ? 0 : ( (ncell+1) / 2 );
  *imax = ( ! *has_hi ) ?     ( (ncell+1) / 2 - 1 ) : ( ncell - 1 );

  *imax_up2 = ( is_semiblocked &&
                ( ncell % 2 ) &&
                ( ! is_semiblock_lo ) )
              ?  ( *imax + 1 ) : *imax;
}